

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O3

bool dxil_spv::analyze_magic_ags_instruction(Impl *impl)

{
  AgsInstruction *__dest;
  CallInst **ppCVar1;
  CallInst **ppCVar2;
  uint uVar3;
  CallInst *pCVar4;
  CallInst *pCVar5;
  CallInst *pCVar6;
  CallInst *pCVar7;
  bool bVar8;
  Id type_id;
  uint32_t uVar9;
  ulong uVar10;
  uint32_t output_immediate;
  uint32_t local_1c;
  
  uVar3 = (impl->ags).num_instructions;
  bVar8 = true;
  if (uVar3 == 0) {
    return true;
  }
  switch((impl->ags).instructions[0].opcode) {
  case 0x28:
    if (uVar3 != 0x15) {
      return true;
    }
    type_id = get_matmul_result_type(impl,(impl->ags).instructions[0xc].immediate & 0x7f);
    goto LAB_00179b23;
  case 0x29:
  case 0x2d:
    if (uVar3 != 10) {
      return true;
    }
    uVar9 = (impl->ags).instructions[1].immediate;
    break;
  default:
    goto switchD_00179acb_caseD_2a;
  case 0x2f:
    if (uVar3 != 0xd) {
      return true;
    }
    uVar9 = (impl->ags).instructions[4].immediate;
    break;
  case 0x32:
    if ((5 < uVar3) && ((impl->ags).current_phase == 1)) {
      __dest = (impl->ags).instructions;
      uVar10 = (ulong)(uVar3 - 5);
      memmove(__dest,__dest + uVar10,0x3c);
      pCVar4 = (impl->ags).backdoor_instructions[uVar10 + 4];
      ppCVar1 = (impl->ags).backdoor_instructions + uVar10;
      pCVar5 = ppCVar1[1];
      ppCVar2 = (impl->ags).backdoor_instructions + uVar10 + 2;
      pCVar6 = *ppCVar2;
      pCVar7 = ppCVar2[1];
      (impl->ags).backdoor_instructions[0] = *ppCVar1;
      (impl->ags).backdoor_instructions[1] = pCVar5;
      (impl->ags).backdoor_instructions[2] = pCVar6;
      (impl->ags).backdoor_instructions[3] = pCVar7;
      (impl->ags).backdoor_instructions[4] = pCVar4;
      (impl->ags).num_instructions = 5;
      return true;
    }
    if (uVar3 != 0xd) {
      return true;
    }
    local_1c = 0;
    bVar8 = get_constant_operand
                      (&(impl->ags).backdoor_instructions[4]->super_Instruction,5,&local_1c);
    uVar9 = local_1c;
    if (!bVar8) {
      return false;
    }
    break;
  case 0x33:
    if (uVar3 != 9) {
      return true;
    }
    type_id = build_coopmat_type(impl,(impl->ags).instructions[0].immediate);
    uVar9 = 1;
    goto LAB_00179b28;
  }
  type_id = build_coopmat_type(impl,uVar9);
LAB_00179b23:
  uVar9 = 2;
LAB_00179b28:
  bVar8 = emit_wmma_return_values(impl,type_id,0,uVar9);
switchD_00179acb_caseD_2a:
  return bVar8;
}

Assistant:

bool analyze_magic_ags_instruction(Converter::Impl &impl)
{
	if (impl.ags.num_instructions == 0)
		return true;

	bool has_wmma_return_values = false;
	spv::Id type_id = 0;
	uint32_t phase = 0;

	switch (impl.ags.instructions[0].opcode)
	{
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixUavLoad:
	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixLdsLoad:
		has_wmma_return_values = impl.ags.num_instructions == 10;
		if (has_wmma_return_values)
		{
			type_id = build_coopmat_type(impl, impl.ags.instructions[1].immediate);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixCopy:
		if (impl.ags.current_phase == 1)
		{
			if (impl.ags.num_instructions > 5)
			{
				// Apparently some shaders encode dummy inputs? Shift away useless stuff either way.
				memmove(impl.ags.instructions, impl.ags.instructions + (impl.ags.num_instructions - 5),
				        5 * sizeof(impl.ags.instructions[0]));
				memmove(impl.ags.backdoor_instructions, impl.ags.backdoor_instructions + (impl.ags.num_instructions - 5),
				        5 * sizeof(impl.ags.backdoor_instructions[0]));
				impl.ags.num_instructions = 5;
			}
		}
		has_wmma_return_values = impl.ags.num_instructions == 13;
		if (has_wmma_return_values)
		{
			uint32_t output_immediate = 0;
			if (!get_constant_operand(impl.ags.backdoor_instructions[4], 5, &output_immediate))
				return false;
			type_id = build_coopmat_type(impl, output_immediate);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixMulAcc:
		has_wmma_return_values = impl.ags.num_instructions == 21;
		if (has_wmma_return_values)
		{
			auto opcode = (impl.ags.instructions[12].immediate >> AmdExtD3DShaderIntrinsicsWaveMatrixOpcode_OpsShift) &
			              AmdExtD3DShaderIntrinsicsWaveMatrixOpcode_OpsMask;
			type_id = get_matmul_result_type(impl, opcode);
			phase = 2;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixFill:
		has_wmma_return_values = impl.ags.num_instructions == 9;
		if (has_wmma_return_values)
		{
			type_id = build_coopmat_type(impl, impl.ags.instructions[0].immediate);
			phase = 1;
		}
		break;

	case AmdExtD3DShaderIntrinsicsOpcode_WaveMatrixElementFill:
		 has_wmma_return_values = impl.ags.num_instructions == 13;
		 if (has_wmma_return_values)
		 {
			 type_id = build_coopmat_type(impl, impl.ags.instructions[4].immediate);
			 phase = 2;
		 }
		 break;

	default:
		break;
	}

	if (has_wmma_return_values)
		return emit_wmma_return_values(impl, type_id, 0, phase);
	else
		return true;
}